

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-stream.c
# Opt level: O0

cc_bool ResizeIfNeeded(MemoryStream *memory_stream,size_t minimum_needed_size)

{
  uchar *puVar1;
  size_t local_30;
  size_t new_size;
  uchar *buffer;
  size_t minimum_needed_size_local;
  MemoryStream *memory_stream_local;
  
  if (memory_stream->size < minimum_needed_size) {
    for (local_30 = 1; local_30 < minimum_needed_size; local_30 = local_30 << 1) {
    }
    puVar1 = (uchar *)realloc(memory_stream->buffer,local_30);
    if (puVar1 == (uchar *)0x0) {
      return '\0';
    }
    memory_stream->buffer = puVar1;
    memset(memory_stream->buffer + memory_stream->size,0,local_30 - memory_stream->size);
    memory_stream->size = local_30;
  }
  if (memory_stream->end < minimum_needed_size) {
    memory_stream->end = minimum_needed_size;
  }
  return '\x01';
}

Assistant:

static cc_bool ResizeIfNeeded(MemoryStream* const memory_stream, const size_t minimum_needed_size)
{
	if (minimum_needed_size > memory_stream->size)
	{
		unsigned char *buffer;

		size_t new_size = 1;
		while (new_size < minimum_needed_size)
			new_size <<= 1;

		buffer = (unsigned char*)realloc(memory_stream->buffer, new_size);

		if (buffer == NULL)
			return cc_false;

		memory_stream->buffer = buffer;
		memset(memory_stream->buffer + memory_stream->size, 0, new_size - memory_stream->size);
		memory_stream->size = new_size;
	}

	if (minimum_needed_size > memory_stream->end)
		memory_stream->end = minimum_needed_size;

	return cc_true;
}